

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ditTextureFormatTests.cpp
# Opt level: O1

ConstPixelBufferAccess * dit::anon_unknown_0::getInputAccess(TextureFormat format)

{
  uint uVar1;
  bool bVar2;
  TextureFormat in_RSI;
  ConstPixelBufferAccess *in_RDI;
  long lVar3;
  ulong uVar4;
  TextureFormat local_50;
  IVec3 local_48;
  IVec3 local_3c;
  
  uVar4 = (ulong)in_RSI & 0xffffffff00000000;
  lVar3 = 0;
  local_50 = in_RSI;
  do {
    uVar1 = *(uint *)((long)&DAT_0022373c + lVar3);
    bVar2 = tcu::isValid((TextureFormat)(uVar4 | uVar1));
    if (bVar2) {
      in_RSI.type = SNORM_INT8;
      in_RSI.order = uVar1;
      break;
    }
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0xc);
  local_48.m_data[0] = tcu::getPixelSize((TextureFormat)(uVar4 | (ulong)in_RSI & 0xffffffff));
  local_3c.m_data[0] =
       *(int *)((anonymous_namespace)::s_formatData + (ulong)local_50.type * 0x28 + 8) /
       local_48.m_data[0];
  local_3c.m_data[1] = 1;
  local_3c.m_data[2] = 1;
  local_48.m_data[1] = 0;
  local_48.m_data[2] = 0;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (in_RDI,&local_50,&local_3c,&local_48,
             *(void **)((anonymous_namespace)::s_formatData + (ulong)local_50.type * 0x28));
  return in_RDI;
}

Assistant:

ConstPixelBufferAccess getInputAccess (TextureFormat format)
{
	const TextureFormat	inputFormat		= getBaseFormat(format);
	const int			inputPixelSize	= getPixelSize(inputFormat);
	const int			numPixels		= s_formatData[format.type].inputSize / inputPixelSize;

	DE_ASSERT(numPixels == 4);
	DE_ASSERT(numPixels*inputPixelSize == s_formatData[format.type].inputSize);

	return ConstPixelBufferAccess(format, IVec3(numPixels, 1, 1), IVec3(inputPixelSize, 0, 0), s_formatData[format.type].input);
}